

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alSource3f(void)

{
  uint32 name_00;
  ALenum param_00;
  float value1_00;
  float value2_00;
  float value3_00;
  ALfloat value3;
  ALfloat value2;
  ALfloat value1;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    value1_00 = IO_FLOAT();
    value2_00 = IO_FLOAT();
    value3_00 = IO_FLOAT();
    if (io_failure == 0) {
      visit_alSource3f((CallerInfo *)&param,name_00,param_00,value1_00,value2_00,value3_00);
    }
  }
  return;
}

Assistant:

static void decode_alSource3f(void)
{
    IO_START(alSource3f);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    const ALfloat value1 = IO_FLOAT();
    const ALfloat value2 = IO_FLOAT();
    const ALfloat value3 = IO_FLOAT();
    if (!io_failure) visit_alSource3f(&callerinfo, name, param, value1, value2, value3);
    IO_END();
}